

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

int arg(int argc,char **argv,int *i)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  Fl_Plugin *pFVar5;
  int index;
  int local_4c;
  Fl_Plugin_Manager pm;
  
  iVar3 = *i;
  pcVar2 = argv[iVar3];
  cVar1 = pcVar2[1];
  if (cVar1 == 'c') {
    if (pcVar2[2] == 's') {
      if (pcVar2[3] == '\0') {
        compile_file = compile_file + 1;
        compile_strings = compile_strings + 1;
        goto LAB_0019c103;
      }
    }
    else if (pcVar2[2] == '\0') {
      compile_file = compile_file + 1;
LAB_0019c103:
      batch_mode = batch_mode + 1;
      *i = *i + 1;
      return 1;
    }
  }
  else if (cVar1 == 'h') {
    if (pcVar2[2] == '\0') {
      header_file_name = argv[(long)iVar3 + 1];
      header_file_set = 1;
LAB_0019c05e:
      *i = *i + 2;
      return 2;
    }
  }
  else if (cVar1 == 'o') {
    if ((pcVar2[2] == '\0') && (iVar3 + 1 < argc)) {
      code_file_name = argv[(long)iVar3 + 1];
      code_file_set = 1;
      goto LAB_0019c05e;
    }
  }
  else if ((cVar1 == 'u') && (pcVar2[2] == '\0')) {
    update_file = update_file + 1;
    goto LAB_0019c103;
  }
  Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&pm.super_Fl_Preferences,"commandline");
  iVar3 = Fl_Preferences::groups(&pm.super_Fl_Preferences);
  local_4c = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  index = 0;
  do {
    iVar4 = local_4c;
    if (iVar3 == index) break;
    pFVar5 = Fl_Plugin_Manager::plugin(&pm,index);
    iVar4 = (*pFVar5->_vptr_Fl_Plugin[5])(pFVar5,argc,argv,i);
    index = index + 1;
  } while (iVar4 == 0);
  local_4c = iVar4;
  Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
  return local_4c;
}

Assistant:

static int arg(int argc, char** argv, int& i) {
  if (argv[i][1] == 'u' && !argv[i][2]) {update_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && !argv[i][2]) {compile_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && argv[i][2] == 's' && !argv[i][3]) {compile_file++; compile_strings++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'o' && !argv[i][2] && i+1 < argc) {
    code_file_name = argv[i+1];
    code_file_set  = 1;
    i += 2;
    return 2;
  }
  if (argv[i][1] == 'h' && !argv[i][2]) {
    header_file_name = argv[i+1];
    header_file_set  = 1;
    i += 2;
    return 2;
  }
  Fl_Plugin_Manager pm("commandline");
  int j, n = pm.plugins();
  for (j=0; j<n; j++) {
    Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(j);
    int r = pi->arg(argc, argv, i);
    if (r) return r;
  }
  return 0;
}